

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O3

void __thiscall
Fl_Graphics_Driver::xyline(Fl_Graphics_Driver *this,int x,int y,int x1,int y2,int x3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined2 uVar4;
  XPoint p [4];
  undefined2 local_18;
  undefined2 local_16;
  undefined2 local_14;
  undefined2 local_12;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  
  iVar2 = 1;
  if (1 < fl_line_width_) {
    iVar2 = fl_line_width_;
  }
  iVar3 = 0x7fff - iVar2;
  iVar2 = -iVar2;
  iVar1 = x;
  if (iVar3 < x) {
    iVar1 = iVar3;
  }
  uVar4 = (undefined2)iVar2;
  local_18 = (short)iVar1;
  if (x < iVar2) {
    local_18 = uVar4;
  }
  iVar1 = y;
  if (iVar3 < y) {
    iVar1 = iVar3;
  }
  local_16 = (short)iVar1;
  if (y < iVar2) {
    local_16 = uVar4;
  }
  local_14 = (short)x1;
  if (iVar3 < x1) {
    local_14 = (short)iVar3;
  }
  if (x1 < iVar2) {
    local_14 = uVar4;
  }
  local_e = (short)y2;
  if (iVar3 < y2) {
    local_e = (short)iVar3;
  }
  if (y2 < iVar2) {
    local_e = uVar4;
  }
  if (x3 <= iVar3) {
    iVar3 = x3;
  }
  local_c = (short)iVar3;
  if (x3 < iVar2) {
    local_c = uVar4;
  }
  local_12 = local_16;
  local_10 = local_14;
  local_a = local_e;
  XDrawLines(fl_display,fl_window,fl_gc,&local_18,4,0);
  return;
}

Assistant:

void Fl_Graphics_Driver::xyline(int x, int y, int x1, int y2, int x3) {
#if defined(USE_X11)
  XPoint p[4];
  p[0].x = clip_x(x);  p[0].y = p[1].y = clip_x(y);
  p[1].x = p[2].x = clip_x(x1); p[2].y = p[3].y = clip_x(y2);
  p[3].x = clip_x(x3);
  XDrawLines(fl_display, fl_window, fl_gc, p, 4, 0);
#elif defined(WIN32)
  if(x3 < x1) x3--;
  else x3++;
  MoveToEx(fl_gc, x, y, 0L); 
  LineTo(fl_gc, x1, y);
  LineTo(fl_gc, x1, y2);
  LineTo(fl_gc, x3, y2);
#elif defined(__APPLE_QUARTZ__)
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, true);
  CGContextMoveToPoint(fl_gc, x, y);
  CGContextAddLineToPoint(fl_gc, x1, y);
  CGContextAddLineToPoint(fl_gc, x1, y2);
  CGContextAddLineToPoint(fl_gc, x3, y2);
  CGContextStrokePath(fl_gc);
  if (Fl_Display_Device::high_resolution()) {
    CGContextFillRect(fl_gc, CGRectMake(x-0.5, y  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
    CGContextFillRect(fl_gc, CGRectMake(x3-0.5, y2  - fl_quartz_line_width_/2, 1 , fl_quartz_line_width_));
  }
  if (USINGQUARTZPRINTER || fl_quartz_line_width_ > 1.5f) CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}